

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_gamma_file3.hpp
# Opt level: O2

pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
* __thiscall
packed_gamma_file3<unsigned_int,_6UL>::run_length_encode
          (pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           *__return_storage_ptr__,packed_gamma_file3<unsigned_int,_6UL> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *V)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  value_type local_34;
  
  (__return_storage_ptr__->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uVar3 = 0;
  while( true ) {
    uVar2 = uVar3;
    puVar1 = (V->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (long)(V->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
    if (uVar3 <= uVar2) break;
    if ((uVar3 - 1 == uVar2) || (uVar3 = (ulong)((int)uVar2 + 1), puVar1[uVar2] != puVar1[uVar3])) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&__return_storage_ptr__->first,&local_34);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&__return_storage_ptr__->second,
                 (V->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar2);
      uVar3 = (ulong)((int)uVar2 + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

pair<vector<itype>, vector<itype> > run_length_encode(vector<itype> & V){

		pair<vector<itype>, vector<itype> > R;
		itype l = 1;
		itype n = 0;

		for(itype i=0;i<V.size();++i){

			if(i == V.size()-1 || V[i] != V[i+1]){

				R.first.push_back(l);
				R.second.push_back(V[i]);

				n+=l;

				l = 1;

			}else{

				++l;

			}

		}

		assert(n == V.size());

		return R;

	}